

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astMakeByteArrayNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t astNode;
  size_t i;
  size_t index;
  sysbvm_tuple_t size;
  anon_struct_16_2_87263bca gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.result = 0;
  gcFrame.element = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 2;
  local_30 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_48);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  uVar1 = *(ulong *)(*arguments + 0x28);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    size = (sysbvm_tuple_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  else {
    size = 0;
  }
  gcFrame.result = sysbvm_byteArray_create(context,size);
  for (index = 0; size != index; index = index + 1) {
    uVar1 = *(ulong *)(*arguments + 0x28);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      astNode = *(sysbvm_tuple_t *)(uVar1 + 0x10 + index * 8);
    }
    else {
      astNode = 0;
    }
    gcFrame.element =
         sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,astNode,arguments[1]);
    sysbvm_arrayOrByteArray_atPut(gcFrame.result,index,gcFrame.element);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_48);
  return gcFrame.result;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMakeByteArrayNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMakeByteArrayNode_t **byteArrayNode = (sysbvm_astMakeByteArrayNode_t**)node;

    struct {
        sysbvm_tuple_t result;
        sysbvm_tuple_t element;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*byteArrayNode)->super.sourcePosition);

    size_t expressionCount = sysbvm_array_getSize((*byteArrayNode)->elements);
    gcFrame.result = sysbvm_byteArray_create(context, expressionCount);
    for(size_t i = 0; i < expressionCount; ++i)
    {
        sysbvm_tuple_t expression = sysbvm_array_at((*byteArrayNode)->elements, i);
        gcFrame.element = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, expression, *environment);
        sysbvm_arrayOrByteArray_atPut(gcFrame.result, i, gcFrame.element);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}